

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledOutputFile.cpp
# Opt level: O1

void __thiscall Imf_3_4::TiledOutputFile::copyPixels(TiledOutputFile *this,TiledInputFile *in)

{
  pointer *ppiVar1;
  LineOrder LVar2;
  Compression CVar3;
  LevelMode LVar4;
  Data *pDVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  Header *this_00;
  TileDescription *pTVar11;
  TileDescription *pTVar12;
  Box2i *pBVar13;
  Box2i *pBVar14;
  LineOrder *pLVar15;
  Compression *pCVar16;
  ChannelList *this_01;
  ChannelList *other;
  char *pcVar17;
  ostream *poVar18;
  LogicExc *this_02;
  ArgExc *pAVar19;
  LevelRoundingMode LVar20;
  int i_l;
  size_type __n;
  ulong uVar21;
  uint uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  int iVar25;
  TileCoord TVar26;
  int ly;
  int lx;
  int dy;
  int dx;
  int pixelDataSize;
  pthread_mutex_t *local_218;
  char *pixelData;
  vector<int,_std::allocator<int>_> ly_table;
  vector<int,_std::allocator<int>_> lx_table;
  vector<int,_std::allocator<int>_> dy_table;
  vector<int,_std::allocator<int>_> dx_table;
  
  local_218 = (pthread_mutex_t *)this->_streamData;
  iVar7 = pthread_mutex_lock(local_218);
  if (iVar7 != 0) {
    std::__throw_system_error(iVar7);
  }
  pDVar5 = this->_data;
  this_00 = TiledInputFile::header(in);
  bVar6 = Header::hasTileDescription(&pDVar5->header);
  if ((!bVar6) || (bVar6 = Header::hasTileDescription(this_00), !bVar6)) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)&dx_table);
    ppiVar1 = &dx_table.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)ppiVar1,"Cannot perform a quick pixel copy from image file \"",0x33);
    pcVar17 = TiledInputFile::fileName(in);
    poVar18 = std::operator<<((ostream *)ppiVar1,pcVar17);
    std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\" to image file \"",0x11);
    pcVar17 = OStream::fileName(this->_streamData->os);
    poVar18 = std::operator<<(poVar18,pcVar17);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar18,
               "\".  The output file is tiled, but the input file is not.  Try using OutputFile::copyPixels() instead."
               ,0x65);
    pAVar19 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar19,(stringstream *)&dx_table);
    __cxa_throw(pAVar19,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  pTVar11 = Header::tileDescription(&pDVar5->header);
  pTVar12 = Header::tileDescription(this_00);
  if ((pTVar11->xSize != pTVar12->xSize) ||
     (((pTVar11->ySize != pTVar12->ySize || (pTVar11->mode != pTVar12->mode)) ||
      (LVar20 = pTVar11->roundingMode, LVar20 != pTVar12->roundingMode)))) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)&dx_table);
    ppiVar1 = &dx_table.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)ppiVar1,"Quick pixel copy from image file \"",0x22);
    pcVar17 = TiledInputFile::fileName(in);
    poVar18 = std::operator<<((ostream *)ppiVar1,pcVar17);
    std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\" to image file \"",0x11);
    pcVar17 = OStream::fileName(this->_streamData->os);
    poVar18 = std::operator<<(poVar18,pcVar17);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar18,"\" failed. The files have different tile descriptions.",0x35);
    pAVar19 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar19,(stringstream *)&dx_table);
    __cxa_throw(pAVar19,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  pBVar13 = Header::dataWindow(&pDVar5->header);
  pBVar14 = Header::dataWindow(this_00);
  iVar7 = -(uint)((pBVar14->min).x == (pBVar13->min).x);
  iVar25 = -(uint)((pBVar14->min).y == (pBVar13->min).y);
  auVar23._4_4_ = iVar7;
  auVar23._0_4_ = iVar7;
  auVar23._8_4_ = iVar25;
  auVar23._12_4_ = iVar25;
  iVar7 = movmskpd(LVar20,auVar23);
  if ((iVar7 != 3) ||
     (iVar7 = -(uint)((pBVar14->max).x == (pBVar13->max).x),
     iVar25 = -(uint)((pBVar14->max).y == (pBVar13->max).y), auVar24._4_4_ = iVar7,
     auVar24._0_4_ = iVar7, auVar24._8_4_ = iVar25, auVar24._12_4_ = iVar25,
     iVar7 = movmskpd((int)pBVar14,auVar24), iVar7 != 3)) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)&dx_table);
    ppiVar1 = &dx_table.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)ppiVar1,"Cannot copy pixels from image file \"",0x24);
    pcVar17 = TiledInputFile::fileName(in);
    poVar18 = std::operator<<((ostream *)ppiVar1,pcVar17);
    std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\" to image file \"",0x11);
    pcVar17 = OStream::fileName(this->_streamData->os);
    poVar18 = std::operator<<(poVar18,pcVar17);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar18,"\". The files have different data windows.",0x29);
    pAVar19 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar19,(stringstream *)&dx_table);
    __cxa_throw(pAVar19,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  pLVar15 = Header::lineOrder(&pDVar5->header);
  LVar2 = *pLVar15;
  pLVar15 = Header::lineOrder(this_00);
  if (LVar2 != *pLVar15) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)&dx_table);
    ppiVar1 = &dx_table.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)ppiVar1,"Quick pixel copy from image file \"",0x22);
    pcVar17 = TiledInputFile::fileName(in);
    poVar18 = std::operator<<((ostream *)ppiVar1,pcVar17);
    std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\" to image file \"",0x11);
    pcVar17 = OStream::fileName(this->_streamData->os);
    poVar18 = std::operator<<(poVar18,pcVar17);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar18,"\" failed. The files have different line orders.",0x2f);
    pAVar19 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar19,(stringstream *)&dx_table);
    __cxa_throw(pAVar19,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  pCVar16 = Header::compression(&pDVar5->header);
  CVar3 = *pCVar16;
  pCVar16 = Header::compression(this_00);
  if (CVar3 != *pCVar16) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)&dx_table);
    ppiVar1 = &dx_table.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)ppiVar1,"Quick pixel copy from image file \"",0x22);
    pcVar17 = TiledInputFile::fileName(in);
    poVar18 = std::operator<<((ostream *)ppiVar1,pcVar17);
    std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\" to image file \"",0x11);
    pcVar17 = OStream::fileName(this->_streamData->os);
    poVar18 = std::operator<<(poVar18,pcVar17);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar18,"\" failed. The files use different compression methods.",0x36);
    pAVar19 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar19,(stringstream *)&dx_table);
    __cxa_throw(pAVar19,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  this_01 = Header::channels(&pDVar5->header);
  other = Header::channels(this_00);
  bVar6 = ChannelList::operator==(this_01,other);
  if (!bVar6) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)&dx_table);
    ppiVar1 = &dx_table.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)ppiVar1,"Quick pixel copy from image file \"",0x22);
    pcVar17 = TiledInputFile::fileName(in);
    poVar18 = std::operator<<((ostream *)ppiVar1,pcVar17);
    std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\" to image file \"",0x11);
    pcVar17 = OStream::fileName(this->_streamData->os);
    poVar18 = std::operator<<(poVar18,pcVar17);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar18,"\" failed.  The files have different channel lists.",0x32);
    pAVar19 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar19,(stringstream *)&dx_table);
    __cxa_throw(pAVar19,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  bVar6 = TileOffsets::isEmpty(&this->_data->tileOffsets);
  if (!bVar6) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)&dx_table);
    ppiVar1 = &dx_table.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)ppiVar1,"Quick pixel copy from image file \"",0x22);
    pcVar17 = TiledInputFile::fileName(in);
    poVar18 = std::operator<<((ostream *)ppiVar1,pcVar17);
    std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\" to image file \"",0x11);
    pcVar17 = OStream::fileName(this->_streamData->os);
    poVar18 = std::operator<<(poVar18,pcVar17);
    std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\" failed. \"",0xb);
    pcVar17 = OStream::fileName(this->_streamData->os);
    poVar18 = std::operator<<(poVar18,pcVar17);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar18,"\" already contains pixel data.",0x1e);
    this_02 = (LogicExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::LogicExc::LogicExc(this_02,(stringstream *)&dx_table);
    __cxa_throw(this_02,&Iex_3_4::LogicExc::typeinfo,Iex_3_4::LogicExc::~LogicExc);
  }
  LVar4 = (this->_data->tileDesc).mode;
  if (LVar4 < RIPMAP_LEVELS) {
    uVar22 = 0;
    for (iVar7 = 0; iVar25 = numLevels(this), iVar7 < iVar25; iVar7 = iVar7 + 1) {
      iVar25 = numXTiles(this,iVar7);
      iVar8 = numYTiles(this,iVar7);
      uVar22 = uVar22 + iVar8 * iVar25;
    }
  }
  else {
    if (LVar4 != RIPMAP_LEVELS) {
      pAVar19 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::ArgExc::ArgExc(pAVar19,"Unknown LevelMode format.");
      __cxa_throw(pAVar19,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
    }
    if (this->_data->numYLevels < 1) {
      uVar22 = 0;
    }
    else {
      uVar22 = 0;
      iVar7 = 0;
      do {
        if (0 < this->_data->numXLevels) {
          iVar25 = 0;
          do {
            iVar8 = numXTiles(this,iVar25);
            iVar9 = numYTiles(this,iVar7);
            uVar22 = uVar22 + iVar9 * iVar8;
            iVar25 = iVar25 + 1;
          } while (iVar25 < this->_data->numXLevels);
        }
        iVar7 = iVar7 + 1;
      } while (iVar7 < this->_data->numYLevels);
    }
  }
  LVar2 = this->_data->lineOrder;
  uVar10 = 1;
  if (LVar2 == RANDOM_Y) {
    uVar10 = uVar22;
  }
  __n = (size_type)(int)uVar10;
  std::vector<int,_std::allocator<int>_>::vector(&dx_table,__n,(allocator_type *)&dy_table);
  std::vector<int,_std::allocator<int>_>::vector(&dy_table,__n,(allocator_type *)&lx_table);
  std::vector<int,_std::allocator<int>_>::vector(&lx_table,__n,(allocator_type *)&ly_table);
  std::vector<int,_std::allocator<int>_>::vector(&ly_table,__n,(allocator_type *)&pixelData);
  if (LVar2 == RANDOM_Y) {
    TiledInputFile::tileOrder
              (in,dx_table.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start,
               dy_table.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               lx_table.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               ly_table.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start);
    pDVar5 = this->_data;
    (pDVar5->nextTileToWrite).dx =
         *dx_table.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start;
    (pDVar5->nextTileToWrite).dy =
         *dy_table.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start;
    (pDVar5->nextTileToWrite).lx =
         *lx_table.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start;
    (pDVar5->nextTileToWrite).ly =
         *ly_table.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start;
  }
  if (0 < (int)uVar22) {
    uVar21 = 0;
    do {
      pDVar5 = this->_data;
      dx = (pDVar5->nextTileToWrite).dx;
      dy = (pDVar5->nextTileToWrite).dy;
      lx = (pDVar5->nextTileToWrite).lx;
      ly = (pDVar5->nextTileToWrite).ly;
      TiledInputFile::rawTileData(in,&dx,&dy,&lx,&ly,&pixelData,&pixelDataSize);
      anon_unknown_6::writeTileData
                (this->_streamData,this->_data,dx,dy,lx,ly,pixelData,pixelDataSize);
      if (LVar2 == RANDOM_Y) {
        if ((long)uVar21 < (long)(int)(uVar22 - 1)) {
          pDVar5 = this->_data;
          (pDVar5->nextTileToWrite).dx =
               dx_table.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar21 + 1];
          (pDVar5->nextTileToWrite).dy =
               dy_table.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar21 + 1];
          (pDVar5->nextTileToWrite).lx =
               lx_table.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar21 + 1];
          (pDVar5->nextTileToWrite).ly =
               ly_table.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar21 + 1];
        }
      }
      else {
        TVar26 = Data::nextTileCoord(this->_data,&this->_data->nextTileToWrite);
        this->_data->nextTileToWrite = TVar26;
      }
      uVar21 = uVar21 + 1;
    } while (uVar22 != uVar21);
  }
  if (ly_table.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(ly_table.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)ly_table.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)ly_table.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (lx_table.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(lx_table.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)lx_table.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)lx_table.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (dy_table.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(dy_table.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)dy_table.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)dy_table.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (dx_table.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(dx_table.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)dx_table.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)dx_table.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  pthread_mutex_unlock(local_218);
  return;
}

Assistant:

void
TiledOutputFile::copyPixels (TiledInputFile& in)
{
#if ILMTHREAD_THREADING_ENABLED
    std::lock_guard<std::mutex> lock (*_streamData);
#endif
    //
    // Check if this file's and and the InputFile's
    // headers are compatible.
    //

    const Header& hdr   = _data->header;
    const Header& inHdr = in.header ();

    if (!hdr.hasTileDescription () || !inHdr.hasTileDescription ())
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Cannot perform a quick pixel copy from image "
            "file \""
                << in.fileName ()
                << "\" to image "
                   "file \""
                << fileName ()
                << "\".  The "
                   "output file is tiled, but the input file is not.  "
                   "Try using OutputFile::copyPixels() instead.");

    if (!(hdr.tileDescription () == inHdr.tileDescription ()))
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Quick pixel copy from image "
            "file \""
                << in.fileName ()
                << "\" to image "
                   "file \""
                << fileName ()
                << "\" failed. "
                   "The files have different tile descriptions.");

    if (!(hdr.dataWindow () == inHdr.dataWindow ()))
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Cannot copy pixels from image "
            "file \""
                << in.fileName ()
                << "\" to image "
                   "file \""
                << fileName ()
                << "\". The "
                   "files have different data windows.");

    if (!(hdr.lineOrder () == inHdr.lineOrder ()))
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Quick pixel copy from image "
            "file \""
                << in.fileName ()
                << "\" to image "
                   "file \""
                << fileName ()
                << "\" failed. "
                   "The files have different line orders.");

    if (!(hdr.compression () == inHdr.compression ()))
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Quick pixel copy from image "
            "file \""
                << in.fileName ()
                << "\" to image "
                   "file \""
                << fileName ()
                << "\" failed. "
                   "The files use different compression methods.");

    if (!(hdr.channels () == inHdr.channels ()))
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Quick pixel copy from image "
            "file \""
                << in.fileName ()
                << "\" to image "
                   "file \""
                << fileName ()
                << "\" "
                   "failed.  The files have different channel "
                   "lists.");

    //
    // Verify that no pixel data have been written to this file yet.
    //

    if (!_data->tileOffsets.isEmpty ())
        THROW (
            IEX_NAMESPACE::LogicExc,
            "Quick pixel copy from image "
            "file \""
                << in.fileName ()
                << "\" to image "
                   "file \""
                << _streamData->os->fileName ()
                << "\" "
                   "failed. \""
                << fileName ()
                << "\" "
                   "already contains pixel data.");

    //
    // Calculate the total number of tiles in the file
    //

    int numAllTiles = 0;

    switch (levelMode ())
    {
        case ONE_LEVEL:
        case MIPMAP_LEVELS:

            for (int i_l = 0; i_l < numLevels (); ++i_l)
                numAllTiles += numXTiles (i_l) * numYTiles (i_l);

            break;

        case RIPMAP_LEVELS:

            for (int i_ly = 0; i_ly < numYLevels (); ++i_ly)
                for (int i_lx = 0; i_lx < numXLevels (); ++i_lx)
                    numAllTiles += numXTiles (i_lx) * numYTiles (i_ly);

            break;

        default: throw IEX_NAMESPACE::ArgExc ("Unknown LevelMode format.");
    }

    bool random_y = _data->lineOrder == RANDOM_Y;

    std::vector<int> dx_table (random_y ? numAllTiles : 1);
    std::vector<int> dy_table (random_y ? numAllTiles : 1);
    std::vector<int> lx_table (random_y ? numAllTiles : 1);
    std::vector<int> ly_table (random_y ? numAllTiles : 1);

    if (random_y)
    {
        in.tileOrder (&dx_table[0], &dy_table[0], &lx_table[0], &ly_table[0]);
        _data->nextTileToWrite.dx = dx_table[0];
        _data->nextTileToWrite.dy = dy_table[0];
        _data->nextTileToWrite.lx = lx_table[0];
        _data->nextTileToWrite.ly = ly_table[0];
    }

    for (int i = 0; i < numAllTiles; ++i)
    {
        const char* pixelData;
        int         pixelDataSize;

        int dx = _data->nextTileToWrite.dx;
        int dy = _data->nextTileToWrite.dy;
        int lx = _data->nextTileToWrite.lx;
        int ly = _data->nextTileToWrite.ly;

        in.rawTileData (dx, dy, lx, ly, pixelData, pixelDataSize);
        writeTileData (
            _streamData, _data, dx, dy, lx, ly, pixelData, pixelDataSize);

        if (random_y)
        {
            if (i < numAllTiles - 1)
            {
                _data->nextTileToWrite.dx = dx_table[i + 1];
                _data->nextTileToWrite.dy = dy_table[i + 1];
                _data->nextTileToWrite.lx = lx_table[i + 1];
                _data->nextTileToWrite.ly = ly_table[i + 1];
            }
        }
        else
        {
            _data->nextTileToWrite =
                _data->nextTileCoord (_data->nextTileToWrite);
        }
    }
}